

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.h
# Opt level: O0

void __thiscall TaskSpec::TaskSpec(TaskSpec *this,TaskSpec *oth)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  memory_order __b_1;
  memory_order __b;
  __integral_type in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string *this_00;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *in_stack_ffffffffffffffb0;
  
  *in_RDI = *in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 1));
  this_00 = (string *)(in_RDI + 5);
  std::__cxx11::string::string(this_00,(string *)(in_RSI + 5));
  in_RDI[9] = in_RSI[9];
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(5,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(in_stack_ffffffffffffffb0,
           (vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
            *)this_00);
  return;
}

Assistant:

TaskSpec(const TaskSpec &oth)
        : id_(oth.id_),
          conn_id_(oth.conn_id_),
          request_str_(oth.request_str_),
          epoch_ms_(oth.epoch_ms_),
          work_estimated_(oth.work_estimated_.load()),
          work_done_(oth.work_done_.load()),
          locks_(oth.locks_) {}